

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorBuilder::BuildEnumValue
          (DescriptorBuilder *this,EnumValueDescriptorProto *proto,EnumDescriptor *parent,
          EnumValueDescriptor *result)

{
  Symbol symbol;
  bool bVar1;
  bool bVar2;
  string *psVar3;
  long *plVar4;
  OptionsType *orig_options;
  size_type *psVar5;
  long *plVar6;
  Symbol symbol_00;
  string outer_scope;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  string local_e0;
  long *local_c0;
  long local_b8;
  long local_b0;
  long lStack_a8;
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined4 local_40;
  undefined4 uStack_3c;
  EnumValueDescriptor *pEStack_38;
  
  psVar3 = DescriptorPool::Tables::AllocateString(this->tables_,(proto->name_).ptr_);
  *(string **)result = psVar3;
  *(int32 *)(result + 0x10) = proto->number_;
  *(EnumDescriptor **)(result + 0x18) = parent;
  psVar3 = DescriptorPool::Tables::AllocateString(this->tables_,*(string **)(parent + 8));
  std::__cxx11::string::resize
            ((ulong)psVar3,
             (char)psVar3->_M_string_length - (char)*(undefined8 *)(*(long *)parent + 8));
  std::__cxx11::string::_M_append((char *)psVar3,**(ulong **)result);
  *(string **)(result + 8) = psVar3;
  ValidateSymbolName(this,(proto->name_).ptr_,psVar3,&proto->super_Message);
  if (((proto->_has_bits_).has_bits_[0] & 2) == 0) {
    *(undefined8 *)(result + 0x20) = 0;
  }
  else {
    orig_options = proto->options_;
    if (orig_options == (OptionsType *)0x0) {
      orig_options = (OptionsType *)&_EnumValueOptions_default_instance_;
    }
    AllocateOptionsImpl<google::protobuf::EnumValueDescriptor>
              (this,*(string **)(result + 8),*(string **)(result + 8),orig_options,result);
  }
  local_40 = 5;
  symbol._4_4_ = uStack_3c;
  symbol.type = 5;
  symbol.field_1.enum_value_descriptor = result;
  pEStack_38 = result;
  bVar1 = AddSymbol(this,*(string **)(result + 8),*(void **)(parent + 0x18),*(string **)result,
                    &proto->super_Message,symbol);
  symbol_00.field_1.enum_value_descriptor = result;
  symbol_00._0_8_ = 5;
  bVar2 = FileDescriptorTables::AddAliasUnderParent
                    (this->file_tables_,parent,*(string **)result,symbol_00);
  if ((!bVar1) && (bVar2)) {
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    local_120._M_string_length = 0;
    local_120.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::_M_assign((string *)&local_120);
    if (local_120._M_string_length == 0) {
      std::__cxx11::string::_M_replace((ulong)&local_120,0,(char *)0x0,0x3a6d8d);
    }
    else {
      std::operator+(&local_100,"\"",&local_120);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_100);
      psVar5 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar5) {
        local_e0.field_2._M_allocated_capacity = *psVar5;
        local_e0.field_2._8_8_ = plVar4[3];
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
      }
      else {
        local_e0.field_2._M_allocated_capacity = *psVar5;
        local_e0._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_e0._M_string_length = plVar4[1];
      *plVar4 = (long)psVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_120,(string *)&local_e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
    }
    psVar3 = *(string **)(result + 8);
    std::operator+(&local_60,
                   "Note that enum values use C++ scoping rules, meaning that enum values are siblings of their type, not children of it.  Therefore, \""
                   ,*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)result);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_60);
    local_c0 = &local_b0;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_b0 = *plVar6;
      lStack_a8 = plVar4[3];
    }
    else {
      local_b0 = *plVar6;
      local_c0 = (long *)*plVar4;
    }
    local_b8 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_c0,(ulong)local_120._M_dataplus._M_p);
    local_a0 = &local_90;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_90 = *plVar6;
      lStack_88 = plVar4[3];
    }
    else {
      local_90 = *plVar6;
      local_a0 = (long *)*plVar4;
    }
    local_98 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_a0);
    local_80 = &local_70;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_70 = *plVar6;
      lStack_68 = plVar4[3];
    }
    else {
      local_70 = *plVar6;
      local_80 = (long *)*plVar4;
    }
    local_78 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_80,**(ulong **)parent);
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_100.field_2._M_allocated_capacity = *psVar5;
      local_100.field_2._8_8_ = plVar4[3];
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    }
    else {
      local_100.field_2._M_allocated_capacity = *psVar5;
      local_100._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_100._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_100);
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_e0.field_2._M_allocated_capacity = *psVar5;
      local_e0.field_2._8_8_ = plVar4[3];
      local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    }
    else {
      local_e0.field_2._M_allocated_capacity = *psVar5;
      local_e0._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_e0._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    AddError(this,psVar3,&proto->super_Message,NAME,&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    if (local_80 != &local_70) {
      operator_delete(local_80,local_70 + 1);
    }
    if (local_a0 != &local_90) {
      operator_delete(local_a0,local_90 + 1);
    }
    if (local_c0 != &local_b0) {
      operator_delete(local_c0,local_b0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p,
                      CONCAT71(local_120.field_2._M_allocated_capacity._1_7_,
                               local_120.field_2._M_local_buf[0]) + 1);
    }
  }
  local_120._M_dataplus._M_p = *(pointer *)(result + 0x18);
  local_120._M_string_length =
       CONCAT44(local_120._M_string_length._4_4_,*(undefined4 *)(result + 0x10));
  InsertIfNotPresent<google::protobuf::hash_map<std::pair<google::protobuf::EnumDescriptor_const*,int>,google::protobuf::EnumValueDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<google::protobuf::EnumDescriptor_const*,int>>,std::equal_to<std::pair<google::protobuf::EnumDescriptor_const*,int>>,std::allocator<std::pair<std::pair<google::protobuf::EnumDescriptor_const*,int>const,google::protobuf::EnumValueDescriptor_const*>>>>
            (&this->file_tables_->enum_values_by_number_,(first_type *)&local_120,
             (second_type *)result);
  return;
}

Assistant:

void DescriptorBuilder::BuildEnumValue(const EnumValueDescriptorProto& proto,
                                       const EnumDescriptor* parent,
                                       EnumValueDescriptor* result) {
  result->name_   = tables_->AllocateString(proto.name());
  result->number_ = proto.number();
  result->type_   = parent;

  // Note:  full_name for enum values is a sibling to the parent's name, not a
  //   child of it.
  string* full_name = tables_->AllocateString(*parent->full_name_);
  full_name->resize(full_name->size() - parent->name_->size());
  full_name->append(*result->name_);
  result->full_name_ = full_name;

  ValidateSymbolName(proto.name(), *full_name, proto);

  // Copy options.
  if (!proto.has_options()) {
    result->options_ = NULL;  // Will set to default_instance later.
  } else {
    AllocateOptions(proto.options(), result);
  }

  // Again, enum values are weird because we makes them appear as siblings
  // of the enum type instead of children of it.  So, we use
  // parent->containing_type() as the value's parent.
  bool added_to_outer_scope =
    AddSymbol(result->full_name(), parent->containing_type(), result->name(),
              proto, Symbol(result));

  // However, we also want to be able to search for values within a single
  // enum type, so we add it as a child of the enum type itself, too.
  // Note:  This could fail, but if it does, the error has already been
  //   reported by the above AddSymbol() call, so we ignore the return code.
  bool added_to_inner_scope =
    file_tables_->AddAliasUnderParent(parent, result->name(), Symbol(result));

  if (added_to_inner_scope && !added_to_outer_scope) {
    // This value did not conflict with any values defined in the same enum,
    // but it did conflict with some other symbol defined in the enum type's
    // scope.  Let's print an additional error to explain this.
    string outer_scope;
    if (parent->containing_type() == NULL) {
      outer_scope = file_->package();
    } else {
      outer_scope = parent->containing_type()->full_name();
    }

    if (outer_scope.empty()) {
      outer_scope = "the global scope";
    } else {
      outer_scope = "\"" + outer_scope + "\"";
    }

    AddError(result->full_name(), proto,
             DescriptorPool::ErrorCollector::NAME,
             "Note that enum values use C++ scoping rules, meaning that "
             "enum values are siblings of their type, not children of it.  "
             "Therefore, \"" + result->name() + "\" must be unique within "
             + outer_scope + ", not just within \"" + parent->name() + "\".");
  }

  // An enum is allowed to define two numbers that refer to the same value.
  // FindValueByNumber() should return the first such value, so we simply
  // ignore AddEnumValueByNumber()'s return code.
  file_tables_->AddEnumValueByNumber(result);
}